

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void anon_unknown.dwarf_1a16ba::initNumberSkeletons(UErrorCode *status)

{
  UnicodeString result;
  UCharsTrieBuilder b;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_NUMBER_SKELETONS,cleanupNumberSkeletons);
  icu_63::UCharsTrieBuilder::UCharsTrieBuilder(&b,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::UnicodeString(&result,L"compact-short");
    icu_63::UCharsTrieBuilder::add(&b,&result,0,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"compact-long");
    icu_63::UCharsTrieBuilder::add(&b,&result,1,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"scientific");
    icu_63::UCharsTrieBuilder::add(&b,&result,2,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"engineering");
    icu_63::UCharsTrieBuilder::add(&b,&result,3,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"notation-simple");
    icu_63::UCharsTrieBuilder::add(&b,&result,4,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"base-unit");
    icu_63::UCharsTrieBuilder::add(&b,&result,5,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"percent");
    icu_63::UCharsTrieBuilder::add(&b,&result,6,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"permille");
    icu_63::UCharsTrieBuilder::add(&b,&result,7,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"precision-integer");
    icu_63::UCharsTrieBuilder::add(&b,&result,8,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"precision-unlimited");
    icu_63::UCharsTrieBuilder::add(&b,&result,9,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"precision-currency-standard");
    icu_63::UCharsTrieBuilder::add(&b,&result,10,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"precision-currency-cash");
    icu_63::UCharsTrieBuilder::add(&b,&result,0xb,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-ceiling");
    icu_63::UCharsTrieBuilder::add(&b,&result,0xc,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-floor");
    icu_63::UCharsTrieBuilder::add(&b,&result,0xd,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-down");
    icu_63::UCharsTrieBuilder::add(&b,&result,0xe,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-up");
    icu_63::UCharsTrieBuilder::add(&b,&result,0xf,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-half-even");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x10,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-half-down");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x11,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-half-up");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x12,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"rounding-mode-unnecessary");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x13,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"group-off");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x14,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"group-min2");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x15,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"group-auto");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x16,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"group-on-aligned");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x17,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"group-thousands");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x18,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"latin");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x19,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"unit-width-narrow");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1a,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"unit-width-short");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1b,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"unit-width-full-name");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1c,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"unit-width-iso-code");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1d,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"unit-width-hidden");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1e,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-auto");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x1f,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-always");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x20,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-never");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x21,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-accounting");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x22,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-accounting-always");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x23,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-except-zero");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x24,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"sign-accounting-except-zero");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x25,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"decimal-auto");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x26,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    icu_63::UnicodeString::UnicodeString(&result,L"decimal-always");
    icu_63::UCharsTrieBuilder::add(&b,&result,0x27,status);
    icu_63::UnicodeString::~UnicodeString(&result);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(&result,L"precision-increment");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x28,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"measure-unit");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x29,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"per-measure-unit");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x2a,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"currency");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x2b,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"integer-width");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x2c,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"numbering-system");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x2d,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      icu_63::UnicodeString::UnicodeString(&result,L"scale");
      icu_63::UCharsTrieBuilder::add(&b,&result,0x2e,status);
      icu_63::UnicodeString::~UnicodeString(&result);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        result.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268
        ;
        result.fUnion.fStackFields.fLengthAndFlags = 2;
        icu_63::UCharsTrieBuilder::buildUnicodeString(&b,USTRINGTRIE_BUILD_FAST,&result,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if (-1 < result.fUnion.fStackFields.fLengthAndFlags) {
            result.fUnion.fFields.fLength = (int)result.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          (anonymous_namespace)::kSerializedStemTrie =
               uprv_malloc_63((long)result.fUnion.fFields.fLength * 2);
          if ((result.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
            if ((result.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
              result.fUnion.fFields.fArray = (char16_t *)((long)&result.fUnion + 2);
            }
          }
          else {
            result.fUnion.fFields.fArray = (char16_t *)0x0;
          }
          memcpy((anonymous_namespace)::kSerializedStemTrie,result.fUnion.fFields.fArray,
                 (long)result.fUnion.fFields.fLength * 2);
        }
        icu_63::UnicodeString::~UnicodeString(&result);
      }
    }
  }
  icu_63::UCharsTrieBuilder::~UCharsTrieBuilder(&b);
  return;
}

Assistant:

void U_CALLCONV initNumberSkeletons(UErrorCode& status) {
    ucln_i18n_registerCleanup(UCLN_I18N_NUMBER_SKELETONS, cleanupNumberSkeletons);

    UCharsTrieBuilder b(status);
    if (U_FAILURE(status)) { return; }

    // Section 1:
    b.add(u"compact-short", STEM_COMPACT_SHORT, status);
    b.add(u"compact-long", STEM_COMPACT_LONG, status);
    b.add(u"scientific", STEM_SCIENTIFIC, status);
    b.add(u"engineering", STEM_ENGINEERING, status);
    b.add(u"notation-simple", STEM_NOTATION_SIMPLE, status);
    b.add(u"base-unit", STEM_BASE_UNIT, status);
    b.add(u"percent", STEM_PERCENT, status);
    b.add(u"permille", STEM_PERMILLE, status);
    b.add(u"precision-integer", STEM_PRECISION_INTEGER, status);
    b.add(u"precision-unlimited", STEM_PRECISION_UNLIMITED, status);
    b.add(u"precision-currency-standard", STEM_PRECISION_CURRENCY_STANDARD, status);
    b.add(u"precision-currency-cash", STEM_PRECISION_CURRENCY_CASH, status);
    b.add(u"rounding-mode-ceiling", STEM_ROUNDING_MODE_CEILING, status);
    b.add(u"rounding-mode-floor", STEM_ROUNDING_MODE_FLOOR, status);
    b.add(u"rounding-mode-down", STEM_ROUNDING_MODE_DOWN, status);
    b.add(u"rounding-mode-up", STEM_ROUNDING_MODE_UP, status);
    b.add(u"rounding-mode-half-even", STEM_ROUNDING_MODE_HALF_EVEN, status);
    b.add(u"rounding-mode-half-down", STEM_ROUNDING_MODE_HALF_DOWN, status);
    b.add(u"rounding-mode-half-up", STEM_ROUNDING_MODE_HALF_UP, status);
    b.add(u"rounding-mode-unnecessary", STEM_ROUNDING_MODE_UNNECESSARY, status);
    b.add(u"group-off", STEM_GROUP_OFF, status);
    b.add(u"group-min2", STEM_GROUP_MIN2, status);
    b.add(u"group-auto", STEM_GROUP_AUTO, status);
    b.add(u"group-on-aligned", STEM_GROUP_ON_ALIGNED, status);
    b.add(u"group-thousands", STEM_GROUP_THOUSANDS, status);
    b.add(u"latin", STEM_LATIN, status);
    b.add(u"unit-width-narrow", STEM_UNIT_WIDTH_NARROW, status);
    b.add(u"unit-width-short", STEM_UNIT_WIDTH_SHORT, status);
    b.add(u"unit-width-full-name", STEM_UNIT_WIDTH_FULL_NAME, status);
    b.add(u"unit-width-iso-code", STEM_UNIT_WIDTH_ISO_CODE, status);
    b.add(u"unit-width-hidden", STEM_UNIT_WIDTH_HIDDEN, status);
    b.add(u"sign-auto", STEM_SIGN_AUTO, status);
    b.add(u"sign-always", STEM_SIGN_ALWAYS, status);
    b.add(u"sign-never", STEM_SIGN_NEVER, status);
    b.add(u"sign-accounting", STEM_SIGN_ACCOUNTING, status);
    b.add(u"sign-accounting-always", STEM_SIGN_ACCOUNTING_ALWAYS, status);
    b.add(u"sign-except-zero", STEM_SIGN_EXCEPT_ZERO, status);
    b.add(u"sign-accounting-except-zero", STEM_SIGN_ACCOUNTING_EXCEPT_ZERO, status);
    b.add(u"decimal-auto", STEM_DECIMAL_AUTO, status);
    b.add(u"decimal-always", STEM_DECIMAL_ALWAYS, status);
    if (U_FAILURE(status)) { return; }

    // Section 2:
    b.add(u"precision-increment", STEM_PRECISION_INCREMENT, status);
    b.add(u"measure-unit", STEM_MEASURE_UNIT, status);
    b.add(u"per-measure-unit", STEM_PER_MEASURE_UNIT, status);
    b.add(u"currency", STEM_CURRENCY, status);
    b.add(u"integer-width", STEM_INTEGER_WIDTH, status);
    b.add(u"numbering-system", STEM_NUMBERING_SYSTEM, status);
    b.add(u"scale", STEM_SCALE, status);
    if (U_FAILURE(status)) { return; }

    // Build the CharsTrie
    // TODO: Use SLOW or FAST here?
    UnicodeString result;
    b.buildUnicodeString(USTRINGTRIE_BUILD_FAST, result, status);
    if (U_FAILURE(status)) { return; }

    // Copy the result into the global constant pointer
    size_t numBytes = result.length() * sizeof(char16_t);
    kSerializedStemTrie = static_cast<char16_t*>(uprv_malloc(numBytes));
    uprv_memcpy(kSerializedStemTrie, result.getBuffer(), numBytes);
}